

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O0

uint32_t __thiscall
utf16iterator<const_unsigned_short_*>::operator*(utf16iterator<const_unsigned_short_*> *this)

{
  ushort uVar1;
  uint16_t b1;
  uint16_t b0;
  unsigned_short *p;
  utf16iterator<const_unsigned_short_*> *this_local;
  
  uVar1 = *this->_ptr;
  if ((uVar1 < 0xd800) || (0xdbff < uVar1)) {
    this_local._4_4_ = (uint)uVar1;
  }
  else {
    this_local._4_4_ = ((uVar1 & 0x3ff) << 10 | this->_ptr[1] & 0x3ff) + 0x10000;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t operator*() const
    {
        P p= _ptr;
        uint16_t b0= *p++;
        if (b0>=0xd800 && b0<0xdc00) {
            uint16_t b1= *p++;
            return (((b0&0x3ff)<<10)|(b1&0x3ff))+0x10000;
        }
        else {
            return b0;
        }
    }